

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toupperhashstrategy.cpp
# Opt level: O3

char * __thiscall ToUpperHashStrategy::hash(ToUpperHashStrategy *this,char *str)

{
  uint uVar1;
  size_t sVar2;
  char *__s;
  ulong uVar3;
  
  sVar2 = strlen(str);
  uVar1 = (uint)sVar2;
  __s = (char *)operator_new__((long)(int)(uVar1 + 1));
  memset(__s,0,(long)(int)(uVar1 + 1));
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      __s[uVar3] = str[uVar3] + -0x20;
      uVar3 = uVar3 + 1;
    } while ((uVar1 & 0x7fffffff) != uVar3);
  }
  return __s;
}

Assistant:

char* ToUpperHashStrategy::hash(const char* str)
{
	int len = strlen(str);
	char* res = new char[len + 1];
	memset(res, 0x00, len + 1);

	for (int i = 0; i < len; ++i) {
		res[i] = toUpper(str[i]);
	}

	return res;

}